

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steed.c
# Opt level: O3

int use_saddle(obj *otmp)

{
  byte *pbVar1;
  char cVar2;
  monst *worm;
  permonst *ppVar3;
  boolean bVar4;
  schar sVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  obj *poVar10;
  char *pcVar11;
  char *line;
  int iVar12;
  schar dy;
  schar dx;
  schar dz;
  char kbuf [256];
  char local_13b;
  char local_13a;
  schar local_139;
  char local_138 [264];
  
  if (((youmonst.data)->mflags1 & 0x2000) != 0) {
    pcVar11 = "You have no hands!";
    goto LAB_0025768c;
  }
  iVar7 = freehand();
  if (iVar7 == 0) {
    pcVar11 = body_part(6);
    line = "You have no free %s.";
    goto LAB_002576ba;
  }
  if (((u._1052_1_ & 3) != 0) ||
     (iVar7 = getdir((char *)0x0,&local_13a,&local_13b,&local_139), iVar7 == 0)) {
    pcVar11 = "Never mind.";
    goto LAB_0025768c;
  }
  if (local_13a == '\0' && local_13b == '\0') {
    pcVar11 = "Saddle yourself?  Very funny...";
    goto LAB_0025768c;
  }
  if ((((0x4e < ((int)u.ux + (int)local_13a) - 1U) || (0x14 < (uint)((int)u.uy + (int)local_13b)))
      || (worm = level->monsters[(uint)((int)u.ux + (int)local_13a)]
                 [(uint)((int)u.uy + (int)local_13b)], worm == (monst *)0x0)) ||
     (uVar9 = *(uint *)&worm->field_0x60, (uVar9 >> 9 & 1) != 0)) {
LAB_0025799c:
    pcVar11 = "I see nobody there.";
LAB_0025768c:
    pline(pcVar11);
    return 0;
  }
  if (worm->wormno == '\0') {
    if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0025780f;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002577be;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002577b5;
    }
    else {
LAB_002577b5:
      if (ublindf == (obj *)0x0) goto LAB_00257853;
LAB_002577be:
      if (ublindf->oartifact != '\x1d') goto LAB_00257853;
    }
    if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
        (((youmonst.data)->mflags3 & 0x100) != 0)) &&
       (((viz_array[worm->my][worm->mx] & 1U) != 0 && ((worm->data->mflags3 & 0x200) != 0))))
    goto LAB_0025780f;
LAB_00257853:
    if (((worm->data->mflags1 & 0x10000) == 0) &&
       ((poVar10 = which_armor(worm,4), poVar10 == (obj *)0x0 ||
        (poVar10 = which_armor(worm,4), poVar10->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002578a4;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025789f;
      }
      else {
LAB_0025789f:
        if (ublindf != (obj *)0x0) {
LAB_002578a4:
          if (ublindf->oartifact == '\x1d') goto LAB_0025791d;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_0025796f;
      }
LAB_0025791d:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar7 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar7 < 0x41))))
      goto LAB_0025796f;
    }
    if ((u.uprops[0x42].intrinsic == 0) &&
       ((u.uprops[0x42].extrinsic == 0 && (bVar4 = match_warn_of_mon(worm), bVar4 == '\0'))))
    goto LAB_0025799c;
  }
  else {
    bVar4 = worm_known(level,worm);
    if (bVar4 == '\0') goto LAB_00257853;
    uVar9 = *(uint *)&worm->field_0x60;
LAB_0025780f:
    if ((((uVar9 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar9 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_00257845;
      goto LAB_00257853;
    }
    if ((uVar9 & 0x280) != 0) goto LAB_00257853;
LAB_00257845:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_00257853;
  }
LAB_0025796f:
  if (((worm->misc_worn_check & 0x100000) == 0) &&
     (poVar10 = which_armor(worm,0x100000), poVar10 == (obj *)0x0)) {
    ppVar3 = worm->data;
    if ((ppVar3 == mons + 0xc || ppVar3 == mons + 0xb) &&
       (((uarmg == (obj *)0x0 && (u.uprops[8].extrinsic == 0)) &&
        (((byte)youmonst.mintrinsics & 0x80) == 0)))) {
      pcVar11 = mon_nam(worm);
      pline("You touch %s.",pcVar11);
      pcVar11 = mons_mname(worm->data);
      pcVar11 = an(pcVar11);
      sprintf(local_138,"attempting to saddle %s",pcVar11);
      bVar4 = delayed_petrify((char *)0x0,local_138);
      if (bVar4 != '\0') {
        pline("You stop your saddling attempt.");
        return 1;
      }
    }
    if (ppVar3 == mons + 0xdb) {
      if (((objects[otmp->otyp].oc_oprop != '\x04') &&
          (bVar4 = obj_resists(otmp,5,0x32), bVar4 == '\0')) &&
         (bVar4 = is_quest_artifact(otmp), bVar4 == '\0')) {
        pcVar11 = Yname2(otmp);
        pline("%s disintegrates!",pcVar11);
        useup(otmp);
      }
      pcVar11 = a_monnam(worm);
      sprintf(local_138,"attempting to saddle %s",pcVar11);
      instadisintegrate(local_138);
    }
    if (ppVar3 == mons + 0x12f || ppVar3 == mons + 0x130) {
      pline("Shame on you!");
      exercise(2,'\0');
    }
    else {
      if ((worm->field_0x63 & 0x3e) != 0) {
        pcVar11 = mon_nam(worm);
        line = "I think %s would mind.";
        goto LAB_002576ba;
      }
      bVar4 = can_saddle(worm);
      if (bVar4 == '\0') {
        pcVar11 = "You can\'t saddle such a creature.";
        goto LAB_0025768c;
      }
      sVar5 = acurr(3);
      sVar6 = acurr(5);
      cVar2 = worm->mtame;
      iVar7 = 0x14;
      if (cVar2 == '\0') {
        iVar7 = 5;
      }
      iVar7 = iVar7 * u.ulevel + (int)(sVar6 / '\x02') + (int)sVar5 + cVar2 * 2;
      if (cVar2 == '\0') {
        iVar7 = iVar7 + (uint)worm->m_lev * -10;
      }
      iVar12 = iVar7 + 0x14;
      if (urole.malenum != 0x15f) {
        iVar12 = iVar7;
      }
      if (u.weapon_skills[0x27].skill != '\x02') {
        if (u.weapon_skills[0x27].skill == '\x03') {
          iVar12 = iVar12 + 0xf;
        }
        else if (u.weapon_skills[0x27].skill == '\x04') {
          iVar12 = iVar12 + 0x1e;
        }
        else {
          iVar12 = iVar12 + -0x14;
        }
      }
      if (((u.uprops[0x1c].intrinsic == 0) && (u.uprops[0x25].intrinsic == 0)) &&
         ((u.uprops[0x25].extrinsic == 0 && (u.uprops[0x29].intrinsic == 0)))) {
        if (((uarmg == (obj *)0x0) ||
            (obj_descr[objects[uarmg->otyp].oc_descr_idx].oc_descr == (char *)0x0)) ||
           (iVar7 = strncmp(obj_descr[objects[uarmg->otyp].oc_descr_idx].oc_descr,"riding ",7),
           iVar7 != 0)) {
          iVar7 = iVar12;
          if ((uarmf != (obj *)0x0) &&
             (obj_descr[objects[uarmf->otyp].oc_descr_idx].oc_descr != (char *)0x0)) {
            iVar8 = strncmp(obj_descr[objects[uarmf->otyp].oc_descr_idx].oc_descr,"riding ",7);
            iVar7 = iVar12 + 10;
            if (iVar8 != 0) {
              iVar7 = iVar12;
            }
          }
        }
        else {
          iVar7 = iVar12 + 10;
        }
      }
      else {
        iVar7 = iVar12 + -0x14;
      }
      iVar12 = iVar7 + -0x32;
      if ((otmp->field_0x4a & 1) == 0) {
        iVar12 = iVar7;
      }
      uVar9 = mt_random();
      if ((int)(uVar9 % 100) < iVar12) {
        mon_nam(worm);
        pline("You put the saddle on %s.");
        if (otmp->owornmask != 0) {
          remove_worn_item(otmp,'\0');
        }
        freeinv(otmp);
        mpickobj(worm,otmp);
        pbVar1 = (byte *)((long)&worm->misc_worn_check + 2);
        *pbVar1 = *pbVar1 | 0x10;
        otmp->owornmask = 0x100000;
        otmp->corpsenm = worm->m_id;
        update_mon_intrinsics(level,worm,otmp,'\x01','\0');
        return 1;
      }
      pcVar11 = Monnam(worm);
      pline("%s resists!",pcVar11);
    }
    return 1;
  }
  pcVar11 = Monnam(worm);
  line = "%s doesn\'t need another one.";
LAB_002576ba:
  pline(line,pcVar11);
  return 0;
}

Assistant:

int use_saddle(struct obj *otmp)
{
	struct monst *mtmp;
	const struct permonst *ptr;
	int chance;
	const char *s;
	schar dx, dy, dz;

	/* Can you use it? */
	if (nohands(youmonst.data)) {
		pline("You have no hands!");	/* not `body_part(HAND)' */
		return 0;
	} else if (!freehand()) {
		pline("You have no free %s.", body_part(HAND));
		return 0;
	}

	/* Select an animal */
	if (u.uswallow || Underwater || !getdir(NULL, &dx, &dy, &dz)) {
	    pline("Never mind.");
	    return 0;
	}
	if (!dx && !dy) {
	    pline("Saddle yourself?  Very funny...");
	    return 0;
	}
	if (!isok(u.ux+dx, u.uy+dy) ||
			!(mtmp = m_at(level, u.ux+dx, u.uy+dy)) ||
			!canspotmon(level, mtmp)) {
	    pline("I see nobody there.");
	    return 0;
	}

	/* Is this a valid monster? */
	if (mtmp->misc_worn_check & W_SADDLE ||
			which_armor(mtmp, W_SADDLE)) {
	    pline("%s doesn't need another one.", Monnam(mtmp));
	    return 0;
	}
	ptr = mtmp->data;
	if (touch_petrifies(ptr) && !uarmg && !Stone_resistance) {
	    char kbuf[BUFSZ];

	    pline("You touch %s.", mon_nam(mtmp));
	    sprintf(kbuf, "attempting to saddle %s", an(mons_mname(mtmp->data)));
	    if (delayed_petrify(NULL, kbuf)) {
		pline("You stop your saddling attempt.");
		return 1;
	    }
	}
	if (touch_disintegrates(ptr)) {
	    char kbuf[BUFSZ];
	    if (!oresist_disintegration(otmp)) {
		pline("%s disintegrates!", Yname2(otmp));
		useup(otmp);
	    }
	    sprintf(kbuf, "attempting to saddle %s", a_monnam(mtmp));
	    instadisintegrate(kbuf);
	}
	if (ptr == &mons[PM_INCUBUS] || ptr == &mons[PM_SUCCUBUS]) {
	    pline("Shame on you!");
	    exercise(A_WIS, FALSE);
	    return 1;
	}
	if (mtmp->isminion || mtmp->isshk || mtmp->ispriest ||
			mtmp->isgd || mtmp->iswiz) {
	    pline("I think %s would mind.", mon_nam(mtmp));
	    return 0;
	}
	if (!can_saddle(mtmp)) {
	    pline("You can't saddle such a creature.");
	    return 0;
	}

	/* Calculate your chance */
	chance = ACURR(A_DEX) + ACURR(A_CHA)/2 + 2*mtmp->mtame;
	chance += u.ulevel * (mtmp->mtame ? 20 : 5);
	if (!mtmp->mtame) chance -= 10*mtmp->m_lev;
	if (Role_if (PM_KNIGHT))
	    chance += 20;
	switch (P_SKILL(P_RIDING)) {
	case P_ISRESTRICTED:
	case P_UNSKILLED:
	default:
	    chance -= 20;	break;
	case P_BASIC:
	    break;
	case P_SKILLED:
	    chance += 15;	break;
	case P_EXPERT:
	    chance += 30;	break;
	}
	if (Confusion || Fumbling || Glib)
	    chance -= 20;
	else if (uarmg &&
		(s = OBJ_DESCR(objects[uarmg->otyp])) != NULL &&
		!strncmp(s, "riding ", 7))
	    /* Bonus for wearing "riding" (but not fumbling) gloves */
	    chance += 10;
	else if (uarmf &&
		(s = OBJ_DESCR(objects[uarmf->otyp])) != NULL &&
		!strncmp(s, "riding ", 7))
	    /* ... or for "riding boots" */
	    chance += 10;
	if (otmp->cursed)
	    chance -= 50;

	/* Make the attempt */
	if (rn2(100) < chance) {
	    pline("You put the saddle on %s.", mon_nam(mtmp));
	    if (otmp->owornmask) remove_worn_item(otmp, FALSE);
	    freeinv(otmp);
	    /* mpickobj may free otmp it if merges, but we have already
	       checked for a saddle above, so no merger should happen */
	    mpickobj(mtmp, otmp);
	    mtmp->misc_worn_check |= W_SADDLE;
	    otmp->owornmask = W_SADDLE;
	    otmp->leashmon = mtmp->m_id;
	    update_mon_intrinsics(level, mtmp, otmp, TRUE, FALSE);
	} else
	    pline("%s resists!", Monnam(mtmp));
	return 1;
}